

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O3

void cheby_u_poly_coef(int n,double *c)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  double *pdVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  double *pdVar9;
  
  if (-1 < n) {
    uVar7 = (ulong)(uint)n;
    uVar1 = uVar7 + 1;
    uVar4 = 0;
    uVar6 = uVar1;
    pdVar5 = c;
    pdVar9 = c;
    do {
      do {
        *pdVar5 = 0.0;
        uVar6 = uVar6 - 1;
        pdVar5 = pdVar5 + uVar7 + 1;
      } while (uVar6 != 0);
      uVar4 = uVar4 + 1;
      pdVar5 = pdVar9 + 1;
      uVar6 = uVar1;
      pdVar9 = pdVar5;
    } while (uVar4 != uVar1);
    *c = 1.0;
    if ((n != 0) && (c[uVar7 + 2] = 2.0, 1 < n)) {
      lVar2 = (long)(int)uVar1;
      pdVar5 = c + 1;
      uVar7 = 2;
      lVar8 = 0;
      do {
        c[uVar7] = -c[uVar7 - 2];
        lVar3 = lVar8;
        pdVar9 = pdVar5;
        if (2 < uVar7) {
          do {
            pdVar9[lVar2 + 1] = (*pdVar9 + *pdVar9) - pdVar9[lVar2 + -1];
            lVar3 = lVar3 + -1;
            pdVar9 = pdVar9 + lVar2;
          } while (lVar3 != 0);
        }
        c[uVar7 + (long)((int)uVar1 * ((int)uVar7 + -1))] =
             c[uVar7 + (uVar7 - 2) * lVar2 + -1] + c[uVar7 + (uVar7 - 2) * lVar2 + -1];
        c[(n + 2) * (int)uVar7] = c[(uVar7 - 1) * (lVar2 + 1)] + c[(uVar7 - 1) * (lVar2 + 1)];
        uVar7 = uVar7 + 1;
        pdVar5 = pdVar5 + 1;
        lVar8 = lVar8 + 1;
      } while (uVar7 != uVar1);
    }
  }
  return;
}

Assistant:

void cheby_u_poly_coef ( int n, double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    CHEBY_U_POLY_COEF evaluates coefficients of Chebyshev polynomials U(n,x).
//
//  First terms:
//
//    N/K     0     1      2      3       4     5      6    7      8    9   10
//
//     0      1
//     1      0     2
//     2     -1     0      4
//     3      0    -4      0      8
//     4      1     0    -12      0      16
//     5      0     6      0    -32       0    32
//     6     -1     0     24      0     -80     0     64
//     7      0    -8      0     80       0  -192      0   128
//
//  Recursion:
//
//    U(0,X) = 1,
//    U(1,X) = 2*X,
//    U(N,X) = 2 * X * U(N-1,X) - U(N-2,X)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    16 February 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input, int N, the highest order polynomial to compute.
//    Note that polynomials 0 through N will be computed.
//
//    Output, double C[(N+1)*((N+1)], the coefficients of the Chebyshev U
//    polynomials.
//
{
  int i;
  int j;

  if ( n < 0 )
  {
    return;
  }

  for ( i = 0; i <= n; i++ )
  {
    for ( j = 0; j <= n; j++ )
    {
      c[i+j*(n+1)] = 0.0;
    }
  }

  c[0+0*(n+1)] = 1.0;

  if ( n == 0 )
  {
    return;
  }

  c[1+1*(n+1)] = 2.0;

  for ( i = 2; i <= n; i++ )
  {
    c[i+0*(n+1)]     =                    - c[i-2+0*(n+1)];
    for ( j = 1; j <= i-2; j++ )
    {
      c[i+j*(n+1)] = 2.0 * c[i-1+(j-1)*(n+1)] - c[i-2+j*(n+1)];
    }

    c[i+(i-1)*(n+1)] = 2.0 * c[i-1+(i-2)*(n+1)];
    c[i+ i   *(n+1)] = 2.0 * c[i-1+(i-1)*(n+1)];
  }

  return;
}